

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InvocationCountShader::shadePrimitives
          (InvocationCountShader *this,GeometryEmitter *output,int verticesIn,
          PrimitivePacket *packets,int numPackets,int invocationID)

{
  PrimitivePacket *pPVar1;
  VertexPacket *pVVar2;
  int i;
  long lVar3;
  int iVar4;
  Vec4 *varyings;
  int iVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  GenericVec4 tipColor;
  Vec4 position1;
  Vec4 position2;
  Vec4 position0;
  Vector<float,_4> res;
  GenericVec4 baseColor;
  undefined1 local_108 [16];
  Vec4 local_f8;
  Vec4 local_e8;
  float local_d0;
  uint local_cc;
  float local_c8;
  deUint32 local_c4;
  deUint32 local_c0;
  deUint32 local_bc;
  Vec4 local_b8;
  uint local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  undefined8 local_88;
  undefined8 auStack_80 [2];
  ulong local_70;
  InvocationCountShader *local_68;
  PrimitivePacket *local_60;
  float local_58 [4];
  Vec4 local_48;
  
  if (0 < numPackets) {
    local_d0 = 1.0;
    if (((uint)(invocationID - (invocationID >> 0x1f)) >> 1 & 1) != 0) {
      local_d0 = 0.0;
    }
    local_90 = (float)invocationID;
    local_98 = (float)(invocationID % 2);
    local_cc = invocationID + 3;
    local_8c = (float)(int)local_cc;
    local_9c = local_cc & 0x80000001;
    local_70 = (ulong)(uint)numPackets;
    uVar6 = 0;
    local_68 = this;
    local_60 = packets;
    do {
      fVar9 = (local_90 / (float)*(int *)&(local_68->super_ShaderProgram).field_0x154) * 5.5;
      pPVar1 = local_60 + uVar6;
      pVVar2 = local_60[uVar6].vertices[0];
      if (local_68->m_testCase == CASE_DIFFERENT_OUTPUT_COUNTS) {
        fVar7 = cosf(fVar9);
        fVar9 = sinf(fVar9);
        local_f8.m_data[1] = fVar9 * 0.6;
        local_f8.m_data[0] = fVar7 * 0.6;
        local_f8.m_data[2] = 0.0;
        local_f8.m_data[3] = 0.0;
        local_b8.m_data[0] = 0.0;
        local_b8.m_data[1] = 0.0;
        local_b8.m_data[2] = 0.0;
        local_b8.m_data[3] = 0.0;
        lVar3 = 0;
        do {
          local_b8.m_data[lVar3] = (pVVar2->position).m_data[lVar3] + local_f8.m_data[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        local_f8.m_data[1] = local_d0;
        local_f8.m_data[0] = local_98;
        local_f8.m_data[2] = 1.0;
        local_f8.m_data[3] = 1.0;
        if (1 < (int)local_cc) {
          iVar4 = 0;
          do {
            fVar9 = (((float)iVar4 + 1.0) / local_8c) * 3.141;
            fVar7 = cosf(fVar9);
            fVar8 = sinf(fVar9);
            local_108._4_4_ = fVar8 * 0.1;
            local_108._0_4_ = fVar7 * 0.1;
            local_108._8_8_ = 0;
            local_e8.m_data[0] = 0.0;
            local_e8.m_data[1] = 0.0;
            local_e8.m_data[2] = 0.0;
            local_e8.m_data[3] = 0.0;
            lVar3 = 0;
            do {
              local_e8.m_data[lVar3] = local_b8.m_data[lVar3] + *(float *)(local_108 + lVar3 * 4);
              lVar3 = lVar3 + 1;
            } while (lVar3 != 4);
            rr::GeometryEmitter::EmitVertex
                      (output,&local_e8,0.0,(GenericVec4 *)&local_f8,pPVar1->primitiveIDIn);
            fVar7 = cosf(fVar9);
            fVar9 = sinf(fVar9);
            local_108._4_4_ = fVar9 * -0.1;
            local_108._0_4_ = fVar7 * 0.1;
            local_108._8_8_ = 0;
            local_e8.m_data[0] = 0.0;
            local_e8.m_data[1] = 0.0;
            local_e8.m_data[2] = 0.0;
            local_e8.m_data[3] = 0.0;
            lVar3 = 0;
            do {
              local_e8.m_data[lVar3] = local_b8.m_data[lVar3] + *(float *)(local_108 + lVar3 * 4);
              lVar3 = lVar3 + 1;
            } while (lVar3 != 4);
            rr::GeometryEmitter::EmitVertex
                      (output,&local_e8,0.0,(GenericVec4 *)&local_f8,pPVar1->primitiveIDIn);
            iVar5 = iVar4 + 3;
            iVar4 = iVar4 + 2;
          } while (iVar5 < (int)local_cc);
        }
        if (local_9c == 1) {
          local_108._0_8_ = 0xbdcccccd;
          local_108._8_8_ = 0;
          local_e8.m_data[0] = 0.0;
          local_e8.m_data[1] = 0.0;
          local_e8.m_data[2] = 0.0;
          local_e8.m_data[3] = 0.0;
          lVar3 = 0;
          do {
            local_e8.m_data[lVar3] = local_b8.m_data[lVar3] + *(float *)(local_108 + lVar3 * 4);
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          iVar4 = pPVar1->primitiveIDIn;
          varyings = &local_f8;
          goto LAB_003b3495;
        }
LAB_003b349a:
        rr::GeometryEmitter::EndPrimitive(output);
      }
      else if (local_68->m_testCase == CASE_FIXED_OUTPUT_COUNTS) {
        fVar7 = cosf(fVar9);
        fVar8 = sinf(fVar9);
        local_f8.m_data[1] = fVar8 * 0.5;
        local_f8.m_data[0] = fVar7 * 0.5;
        local_f8.m_data[2] = 0.0;
        local_f8.m_data[3] = 0.0;
        local_b8.m_data[0] = 0.0;
        local_b8.m_data[1] = 0.0;
        local_b8.m_data[2] = 0.0;
        local_b8.m_data[3] = 0.0;
        lVar3 = 0;
        do {
          local_b8.m_data[lVar3] = (pVVar2->position).m_data[lVar3] + local_f8.m_data[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        local_94 = fVar9 + 0.1;
        fVar7 = cosf(local_94);
        fVar8 = sinf(local_94);
        local_e8.m_data[1] = fVar8 * 0.6;
        local_e8.m_data[0] = fVar7 * 0.6;
        local_e8.m_data[2] = 0.0;
        local_e8.m_data[3] = 0.0;
        local_f8.m_data[0] = 0.0;
        local_f8.m_data[1] = 0.0;
        local_f8.m_data[2] = 0.0;
        local_f8.m_data[3] = 0.0;
        lVar3 = 0;
        do {
          local_f8.m_data[lVar3] = (pVVar2->position).m_data[lVar3] + local_e8.m_data[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        fVar7 = cosf(fVar9 + -0.1);
        fVar9 = sinf(fVar9 + -0.1);
        local_108._4_4_ = fVar9 * 0.6;
        local_108._0_4_ = fVar7 * 0.6;
        local_108._8_8_ = 0;
        local_e8.m_data[0] = 0.0;
        local_e8.m_data[1] = 0.0;
        local_e8.m_data[2] = 0.0;
        local_e8.m_data[3] = 0.0;
        lVar3 = 0;
        do {
          local_e8.m_data[lVar3] =
               (pVVar2->position).m_data[lVar3] + *(float *)(local_108 + lVar3 * 4);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        local_108._0_8_ = 0;
        local_108._8_8_ = 0;
        local_58[0] = 1.0;
        local_58[1] = 1.0;
        local_58[2] = 0.0;
        local_58[3] = 1.0;
        pVVar2 = pPVar1->vertices[0];
        local_c8 = (float)pVVar2->outputs[0].v.uData[0];
        local_c4 = pVVar2->outputs[0].v.uData[1];
        local_c0 = pVVar2->outputs[0].v.uData[2];
        local_bc = pVVar2->outputs[0].v.uData[3];
        local_88 = 0;
        auStack_80[0] = 0;
        lVar3 = 0;
        do {
          *(float *)((long)&local_88 + lVar3 * 4) = local_58[lVar3] * (&local_c8)[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        local_108._0_8_ = local_88;
        local_108._8_8_ = auStack_80[0];
        local_58[0] = 1.0;
        local_58[1] = 0.0;
        local_58[2] = 0.0;
        local_58[3] = 1.0;
        local_88._0_4_ = 0.0;
        local_88._4_4_ = 0.0;
        auStack_80[0]._0_4_ = 0.0;
        auStack_80[0]._4_4_ = 0.0;
        lVar3 = 0;
        do {
          *(float *)((long)&local_88 + lVar3 * 4) = local_58[lVar3] * (&local_c8)[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        local_48.m_data[0] = (float)local_88;
        local_48.m_data[1] = local_88._4_4_;
        local_48.m_data[2] = (float)auStack_80[0];
        local_48.m_data[3] = auStack_80[0]._4_4_;
        rr::GeometryEmitter::EmitVertex
                  (output,&local_b8,0.0,(GenericVec4 *)local_108,pPVar1->primitiveIDIn);
        rr::GeometryEmitter::EmitVertex
                  (output,&local_f8,0.0,(GenericVec4 *)&local_48,pPVar1->primitiveIDIn);
        iVar4 = pPVar1->primitiveIDIn;
        varyings = &local_48;
LAB_003b3495:
        rr::GeometryEmitter::EmitVertex(output,&local_e8,0.0,(GenericVec4 *)varyings,iVar4);
        goto LAB_003b349a;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != local_70);
  }
  return;
}

Assistant:

void InvocationCountShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(verticesIn);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const float				l_angle		= float(invocationID) / float(m_numInvocations) * 5.5f;
		const float				l_radius	= 0.6f;

		const rr::VertexPacket*	vertex		= packets[packetNdx].vertices[0];

		if (m_testCase == CASE_FIXED_OUTPUT_COUNTS)
		{
			const tcu::Vec4			position0	= vertex->position + tcu::Vec4(deFloatCos(l_angle)      * (l_radius - 0.1f), deFloatSin(l_angle)      * (l_radius - 0.1f), 0.0f, 0.0f);
			const tcu::Vec4			position1	= vertex->position + tcu::Vec4(deFloatCos(l_angle+0.1f) * l_radius,          deFloatSin(l_angle+0.1f) * l_radius,          0.0f, 0.0f);
			const tcu::Vec4			position2	= vertex->position + tcu::Vec4(deFloatCos(l_angle-0.1f) * l_radius,          deFloatSin(l_angle-0.1f) * l_radius,          0.0f, 0.0f);

			rr::GenericVec4			tipColor;
			rr::GenericVec4			baseColor;

			tipColor  = tcu::Vec4(1.0, 1.0, 0.0, 1.0) * packets[packetNdx].vertices[0]->outputs[0].get<float>();
			baseColor = tcu::Vec4(1.0, 0.0, 0.0, 1.0) * packets[packetNdx].vertices[0]->outputs[0].get<float>();

			output.EmitVertex(position0, 0.0f, &tipColor, packets[packetNdx].primitiveIDIn);
			output.EmitVertex(position1, 0.0f, &baseColor, packets[packetNdx].primitiveIDIn);
			output.EmitVertex(position2, 0.0f, &baseColor, packets[packetNdx].primitiveIDIn);
			output.EndPrimitive();
		}
		else if (m_testCase == CASE_DIFFERENT_OUTPUT_COUNTS)
		{
			const tcu::Vec4 color			= tcu::Vec4(float(invocationID % 2), (((invocationID / 2) % 2) == 0) ? (1.0f) : (0.0f), 1.0f, 1.0f);
			const tcu::Vec4 basePosition	= vertex->position + tcu::Vec4(deFloatCos(l_angle) * l_radius, deFloatSin(l_angle) * l_radius, 0.0f, 0.0f);
			const int		numNgonVtx		= invocationID + 3;

			rr::GenericVec4	outColor;
			outColor = color;

			for (int ndx = 0; ndx + 1 < numNgonVtx; ndx += 2)
			{
				const float subAngle = (float(ndx) + 1.0f) / float(numNgonVtx) * 3.141f;

				output.EmitVertex(basePosition + tcu::Vec4(deFloatCos(subAngle) * 0.1f, deFloatSin(subAngle) *  0.1f, 0.0f, 0.0f), 0.0f, &outColor, packets[packetNdx].primitiveIDIn);
				output.EmitVertex(basePosition + tcu::Vec4(deFloatCos(subAngle) * 0.1f, deFloatSin(subAngle) * -0.1f, 0.0f, 0.0f), 0.0f, &outColor, packets[packetNdx].primitiveIDIn);
			}

			if ((numNgonVtx % 2) == 1)
				output.EmitVertex(basePosition + tcu::Vec4(-0.1f, 0.0f, 0.0f, 0.0f), 0.0f, &outColor, packets[packetNdx].primitiveIDIn);

			output.EndPrimitive();
		}
	}
}